

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink.h
# Opt level: O2

filename_t *
spdlog::sinks::rotating_file_sink<std::mutex>::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,size_t index)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *extraout_RDX;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *extraout_RDX_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  filename_t ext;
  filename_t basename;
  type w;
  size_t local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_238;
  
  local_238.super_basic_buffer<char>.ptr_ = local_238.store_;
  local_238.super_basic_buffer<char>.size_ = 0;
  local_238.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00207e98;
  local_238.super_basic_buffer<char>.capacity_ = 500;
  local_2d0 = index;
  if (index == 0) {
    ::fmt::v5::format_to<char[3],std::__cxx11::string,500ul,char>
              (&local_238,(char (*) [3])0x1dbb2b,filename);
    buf = extraout_RDX_00;
  }
  else {
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_local_buf[0] = '\0';
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    local_2c8._M_string_length = 0;
    local_2c8.field_2._M_local_buf[0] = '\0';
    details::file_helper::split_by_extenstion
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_278,filename);
    local_288 = &local_2c8;
    local_280 = &local_2a8;
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_288,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_278);
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl(&local_278);
    ::fmt::v5::format_to<char[8],std::__cxx11::string,unsigned_long,std::__cxx11::string,500ul,char>
              (&local_238,(char (*) [8])"{}.{}{}",&local_2a8,&local_2d0,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2a8);
    buf = extraout_RDX;
  }
  ::fmt::v5::to_string<char,500ul>(__return_storage_ptr__,(v5 *)&local_238,buf);
  ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            (&local_238);
  return __return_storage_ptr__;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, std::size_t index)
    {
        typename std::conditional<std::is_same<filename_t::value_type, char>::value, fmt::memory_buffer, fmt::wmemory_buffer>::type w;
        if (index != 0u)
        {
            filename_t basename, ext;
            std::tie(basename, ext) = details::file_helper::split_by_extenstion(filename);
            fmt::format_to(w, SPDLOG_FILENAME_T("{}.{}{}"), basename, index, ext);
        }
        else
        {
            fmt::format_to(w, SPDLOG_FILENAME_T("{}"), filename);
        }
        return fmt::to_string(w);
    }